

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task.hpp
# Opt level: O0

TaskType __thiscall tf::TaskView::type(TaskView *this)

{
  char *pcVar1;
  int in_EDX;
  char *in_RSI;
  long *in_RDI;
  TaskType local_4;
  
  pcVar1 = std::
           variant<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           ::index((variant<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    *)(*in_RDI + 0x88),in_RSI,in_EDX);
  switch(pcVar1) {
  case (char *)0x0:
    local_4 = PLACEHOLDER;
    break;
  case (char *)0x1:
    local_4 = STATIC;
    break;
  case (char *)0x2:
    local_4 = RUNTIME;
    break;
  case (char *)0x3:
    local_4 = SUBFLOW;
    break;
  case (char *)0x4:
    local_4 = CONDITION;
    break;
  case (char *)0x5:
    local_4 = CONDITION;
    break;
  case (char *)0x6:
    local_4 = MODULE;
    break;
  case (char *)0x7:
    local_4 = ASYNC;
    break;
  case (char *)0x8:
    local_4 = ASYNC;
    break;
  default:
    local_4 = UNDEFINED;
  }
  return local_4;
}

Assistant:

inline TaskType TaskView::type() const {
  switch(_node._handle.index()) {
    case Node::PLACEHOLDER:     return TaskType::PLACEHOLDER;
    case Node::STATIC:          return TaskType::STATIC;
    case Node::RUNTIME:         return TaskType::RUNTIME;
    case Node::SUBFLOW:         return TaskType::SUBFLOW;
    case Node::CONDITION:       return TaskType::CONDITION;
    case Node::MULTI_CONDITION: return TaskType::CONDITION;
    case Node::MODULE:          return TaskType::MODULE;
    case Node::ASYNC:           return TaskType::ASYNC;
    case Node::DEPENDENT_ASYNC: return TaskType::ASYNC;
    default:                    return TaskType::UNDEFINED;
  }
}